

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutFlowBC.cpp
# Opt level: O1

bool OutFlowBC::HasOutFlowBC(BCRec *_phys_bc)

{
  bool bVar1;
  long lVar2;
  
  lVar2 = -3;
  bVar1 = false;
  do {
    if (_phys_bc->bc[lVar2 + 3] == 2) {
      bVar1 = true;
    }
    if (_phys_bc[1].bc[lVar2] == 2) {
      bVar1 = true;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return bVar1;
}

Assistant:

bool
OutFlowBC::HasOutFlowBC (BCRec* _phys_bc)
{
    bool has_out_flow = false;
    int  numOutFlowBC = 0;

    for (int idir = 0; idir < BL_SPACEDIM; idir++)
    {
        if (_phys_bc->lo(idir) == Outflow)
        {
            has_out_flow = true;
            numOutFlowBC++;
        }

        if (_phys_bc->hi(idir) == Outflow)
        {
            has_out_flow = true;
            numOutFlowBC++;
        }
    }

    return has_out_flow;
}